

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextboundaryfinder.cpp
# Opt level: O1

qsizetype __thiscall QTextBoundaryFinder::toNextBoundary(QTextBoundaryFinder *this)

{
  QCharAttributes *pQVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  pQVar1 = this->attributes;
  if (((pQVar1 == (QCharAttributes *)0x0) || (lVar2 = this->pos, lVar2 < 0)) ||
     (lVar3 = (this->sv).m_size, lVar3 <= lVar2)) {
    this->pos = -1;
    return -1;
  }
  this->pos = lVar2 + 1;
  switch(this->t) {
  case Grapheme:
    lVar2 = this->pos;
    if (lVar2 < lVar3) {
      do {
        lVar4 = lVar2 + 1;
        if (((byte)pQVar1[lVar2] & 1) != 0) break;
        this->pos = lVar4;
        lVar2 = lVar4;
      } while (lVar4 != lVar3);
    }
    break;
  case Word:
    lVar2 = this->pos;
    if (lVar2 < lVar3) {
      do {
        lVar4 = lVar2 + 1;
        if (((byte)pQVar1[lVar2] & 2) != 0) break;
        this->pos = lVar4;
        lVar2 = lVar4;
      } while (lVar4 != lVar3);
    }
    break;
  case Sentence:
    lVar2 = this->pos;
    if (lVar2 < lVar3) {
      do {
        lVar4 = lVar2 + 1;
        if (((byte)pQVar1[lVar2] & 4) != 0) break;
        this->pos = lVar4;
        lVar2 = lVar4;
      } while (lVar4 != lVar3);
    }
    break;
  case Line:
    lVar2 = this->pos;
    if (lVar2 < lVar3) {
      do {
        lVar4 = lVar2 + 1;
        if (((byte)pQVar1[lVar2] & 8) != 0) break;
        this->pos = lVar4;
        lVar2 = lVar4;
      } while (lVar4 != lVar3);
    }
  }
  return this->pos;
}

Assistant:

qsizetype QTextBoundaryFinder::toNextBoundary()
{
    if (!attributes || pos < 0 || pos >= sv.size()) {
        pos = -1;
        return pos;
    }

    ++pos;
    switch(t) {
    case Grapheme:
        while (pos < sv.size() && !attributes[pos].graphemeBoundary)
            ++pos;
        break;
    case Word:
        while (pos < sv.size() && !attributes[pos].wordBreak)
            ++pos;
        break;
    case Sentence:
        while (pos < sv.size() && !attributes[pos].sentenceBoundary)
            ++pos;
        break;
    case Line:
        while (pos < sv.size() && !attributes[pos].lineBreak)
            ++pos;
        break;
    }

    return pos;
}